

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

bool __thiscall adios2::IO::RemoveAttribute(IO *this,string *name)

{
  byte bVar1;
  undefined8 *in_RDI;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"in call to IO::RemoveAttribute",&local_31);
  helper::CheckForNullptr<adios2::core::IO>((IO *)this,name);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  bVar1 = adios2::core::IO::RemoveAttribute((string *)*in_RDI);
  return (bool)(bVar1 & 1);
}

Assistant:

bool IO::RemoveAttribute(const std::string &name)
{
    helper::CheckForNullptr(m_IO, "in call to IO::RemoveAttribute");
    return m_IO->RemoveAttribute(name);
}